

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__pic_is4(stbi__context *s,char *str)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 4) {
      return 1;
    }
    sVar2 = stbi__get8(s);
    psVar1 = (stbi_uc *)(str + lVar3);
    lVar3 = lVar3 + 1;
  } while (sVar2 == *psVar1);
  return 0;
}

Assistant:

static int stbi__pic_is4(stbi__context *s,const char *str)
{
   int i;
   for (i=0; i<4; ++i)
      if (stbi__get8(s) != (stbi_uc)str[i])
         return 0;

   return 1;
}